

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
DiscardResource<Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler,void>
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          CmdBufferRecycler *Resource,Uint64 FenceValue)

{
  DynamicStaleResourceWrapper local_20;
  
  DynamicStaleResourceWrapper::
  Create<Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler,void>
            (&local_20,Resource,1);
  DiscardResource(this,&local_20,FenceValue);
  DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper(&local_20);
  return;
}

Assistant:

void DiscardResource(ResourceType&& Resource, Uint64 FenceValue)
    {
        DiscardResource(CreateWrapper(std::move(Resource), 1), FenceValue);
    }